

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *in_RCX;
  undefined8 in_RDX;
  long in_R8;
  ulong __n;
  AllocateResult AVar1;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  __n = in_R8 - 1;
  if (__n < 0x1fffffff) {
    AVar1 = BuilderArena::allocate((BuilderArena *)src,(int)__n + 8U >> 3);
    *(undefined4 *)dst = 0xfffffffd;
    *(int *)(dst + 4) = (int)__n * 8 + 10;
    if (__n != 0) {
      memcpy(AVar1.words,in_RCX,__n);
    }
    *(SegmentBuilder **)(dst + 8) = AVar1.segment;
    *(undefined8 *)(dst + 0x10) = in_RDX;
    *(word **)(dst + 0x18) = AVar1.words;
    return (int)dst;
  }
  WireHelpers::setTextPointer::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)dst);
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Text::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setTextPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}